

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

void __thiscall Analyzer::removeNearestAssignmentsFoundAt(Analyzer *this,Node *node)

{
  Node *a;
  pointer ppNVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  size_t i;
  ulong uVar5;
  size_t i_1;
  long lVar6;
  
  if (node != (Node *)0x0 &&
      nearest_assignments.
      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      nearest_assignments.
      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    ppVar3 = nearest_assignments.
             super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = nearest_assignments.
             super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar5 < (ulong)(((long)ppVar3 - (long)ppVar4) / 0x18); uVar5 = uVar5 + 1) {
      a = *(Node **)((long)&ppVar4->first + lVar6);
      if (a != (Node *)0x0) {
        bVar2 = isNodeEquals(this,a,node);
        ppVar3 = nearest_assignments.
                 super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar4 = nearest_assignments.
                 super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (bVar2) {
          *(undefined8 *)
           ((long)&(nearest_assignments.
                    super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar6) = 0;
        }
      }
      lVar6 = lVar6 + 0x18;
    }
    for (uVar5 = 0;
        ppNVar1 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
        uVar5 = uVar5 + 1) {
      removeNearestAssignmentsFoundAt(this,ppNVar1[uVar5]);
    }
  }
  return;
}

Assistant:

void removeNearestAssignmentsFoundAt(Node * node)
  {
    if (!nearest_assignments.size() || !node)
      return;

    for (size_t i = 0; i < nearest_assignments.size(); i++)
      if (nearest_assignments[i].first)
        if (isNodeEquals(nearest_assignments[i].first, node))
          nearest_assignments[i].first = nullptr;

    for (size_t i = 0; i < node->children.size(); i++)
      removeNearestAssignmentsFoundAt(node->children[i]);
  }